

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosidemix.cpp
# Opt level: O0

Color __thiscall TwoSideMix::f(TwoSideMix *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float k;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar1;
  undefined8 extraout_XMM0_Qb;
  undefined4 uVar2;
  vec3f vVar3;
  Color CVar4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar5;
  float k_00;
  undefined4 uVar6;
  float fVar7;
  
  uVar5 = *(undefined4 *)(in_RDI + 0x38);
  (**(code **)**(undefined8 **)(in_RDI + 0x28))
            (*(undefined8 **)(in_RDI + 0x28),in_RSI,in_RDX,in_RCX);
  uVar1 = (undefined4)extraout_XMM0_Qb;
  uVar2 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  k_00 = k;
  uVar6 = extraout_XMM0_Db;
  ::operator*(k,(vec3f *)CONCAT44(uVar5,in_stack_fffffffffffffef0));
  (**(code **)**(undefined8 **)(in_RDI + 0x30))
            (*(undefined8 **)(in_RDI + 0x30),in_RSI,in_RDX,in_RCX);
  ::operator*(k_00,(vec3f *)CONCAT44(uVar5,in_stack_fffffffffffffef0));
  vVar3 = ::operator+((vec3f *)CONCAT44(uVar2,uVar1),(vec3f *)CONCAT44(uVar6,k_00));
  CVar4.x = vVar3.x;
  CVar4.y = vVar3.y;
  register0x00001240 = vVar3.z;
  return CVar4;
}

Assistant:

Color TwoSideMix::f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
{
	return amount * componentA->f(wo,wi,hit)
	 + (1-amount) * componentB->f(wo,wi,hit);
}